

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O0

void __thiscall Vehicle::add_node(Vehicle *this,Point *p,int pos,int *ec)

{
  mapped_type *pmVar1;
  const_iterator local_70;
  int local_64;
  iterator iStack_60;
  int tmp_pos;
  iterator it;
  shared_ptr<VehicleState> local_48;
  undefined1 local_38 [8];
  shared_ptr<VehicleState> possible_state;
  int *ec_local;
  int pos_local;
  Point *p_local;
  Vehicle *this_local;
  
  possible_state.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec;
  std::make_shared<VehicleState,Point*&>((Point **)local_38);
  std::shared_ptr<VehicleState>::shared_ptr(&local_48,(shared_ptr<VehicleState> *)local_38);
  validate_states(this,&local_48,pos,
                  (int *)possible_state.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
  std::shared_ptr<VehicleState>::~shared_ptr(&local_48);
  if (*(int *)&(possible_state.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base == 0) {
    iStack_60 = std::__cxx11::
                list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                ::begin(&this->nodes);
    local_64 = pos;
    while (0 < local_64) {
      local_64 = local_64 + -1;
      std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&stack0xffffffffffffffa0);
    }
    local_64 = local_64 + -1;
    std::_List_const_iterator<std::shared_ptr<VehicleState>_>::_List_const_iterator
              (&local_70,&stack0xffffffffffffffa0);
    std::__cxx11::
    list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::insert
              (&this->nodes,local_70,(value_type *)local_38);
    pmVar1 = std::
             unordered_map<Solution_*,_std::pair<Vehicle_*,_int>,_std::hash<Solution_*>,_std::equal_to<Solution_*>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>_>
             ::operator[](&p->state,&this->solution);
    pmVar1->first = this;
    it._M_node._0_4_ = 0;
  }
  else {
    it._M_node._0_4_ = 1;
  }
  std::shared_ptr<VehicleState>::~shared_ptr((shared_ptr<VehicleState> *)local_38);
  return;
}

Assistant:

void Vehicle::add_node(Point *p, int pos, int &ec) {

    auto possible_state = std::make_shared<VehicleState>(p);
    validate_states(possible_state, pos, ec);
    if (ec)
        return;

    auto it = nodes.begin();
    auto tmp_pos = pos;
    while (tmp_pos-- > 0)
        ++it;

    nodes.insert(it, possible_state);
    p->state[solution].first = this;
}